

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::prepareWord2vecInput
               (string *dir_name,string *out_filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *dict)

{
  pointer pcVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  error_code *peVar5;
  ostream *poVar6;
  istream *piVar7;
  const_iterator cVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  undefined8 *puVar10;
  long local_4b8;
  ofstream of;
  ios_base local_3c0 [264];
  undefined1 local_2b8 [8];
  ifstream fi;
  dir_itr_imp local_2a8 [16];
  uint auStack_298 [122];
  size_type *local_b0;
  path targetDir;
  undefined1 local_88 [8];
  string line;
  directory_iterator local_60;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_b0 = &targetDir.m_pathname._M_string_length;
  pcVar1 = (dir_name->_M_dataplus)._M_p;
  targetDir.m_pathname.field_2._8_8_ = dict;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator(&local_60,(path *)&local_b0,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::ofstream::ofstream((ostream *)&local_4b8,(string *)out_filename,_S_out);
  local_2b8 = (undefined1  [8])local_60.m_imp.px;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  _fi = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_60;
  if (local_60.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_60.m_imp.px = *(int *)local_60.m_imp.px + 1;
    UNLOCK();
  }
  local_48 = it.m_imp.px;
  if (it.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b8);
  local_2b8 = (undefined1  [8])eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b8);
  local_2b8 = (undefined1  [8])local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  local_40.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_2b8);
  do {
    if ((local_38.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) ||
       (((local_38.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) &&
        ((local_40.px == (dir_itr_imp *)0x0 || (*(long *)(local_40.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
      bVar9 = true;
LAB_0010ef62:
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
      local_4b8 = _VTT;
      *(undefined8 *)((long)&local_4b8 + *(long *)(_VTT + -0x18)) = _sentry;
      std::filebuf::~filebuf((filebuf *)&of);
      std::ios_base::~ios_base(local_3c0);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_60.m_imp);
      if (local_b0 != &targetDir.m_pathname._M_string_length) {
        operator_delete(local_b0);
      }
      return bVar9;
    }
    peVar5 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_38);
    boost::filesystem::detail::status((path *)local_2b8,peVar5);
    if (local_2b8._0_4_ == 2) {
      boost::filesystem::path::extension();
      iVar4 = boost::filesystem::path::compare((path *)local_2b8,"swp");
      if (local_2b8 != (undefined1  [8])local_2a8) {
        operator_delete((void *)local_2b8);
      }
      if (iVar4 != 0) {
        std::ifstream::ifstream(local_2b8,(string *)peVar5,_S_in);
        line.field_2._12_4_ = *(uint *)((long)auStack_298 + *(long *)((long)local_2b8 + -0x18));
        if ((line.field_2._12_4_ & 5) == 0) {
          local_88 = (undefined1  [8])&line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)((long)local_2b8 + -0x18) + (char)local_2b8
                                   );
            piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_2b8,(string *)local_88,cVar3);
            if ((((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) ||
               (line._M_dataplus._M_p == (pointer)0x0)) break;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_4b8,(char *)local_88,(long)line._M_dataplus._M_p);
            cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)targetDir.m_pathname.field_2._8_8_,(key_type *)local_88);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              puVar2 = *(undefined8 **)
                        ((long)cVar8.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                               ._M_cur + 0x30);
              for (puVar10 = *(undefined8 **)
                              ((long)cVar8.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                                     ._M_cur + 0x28); puVar10 != puVar2; puVar10 = puVar10 + 4) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," ",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_4b8,(char *)*puVar10,puVar10[1]);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," ",1);
            }
          }
          if (local_88 != (undefined1  [8])&line._M_string_length) {
            operator_delete((void *)local_88);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,*(char **)peVar5,(long)peVar5->cat_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doesn\'t exist",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        std::ifstream::~ifstream(local_2b8);
        if ((line.field_2._12_4_ & 5) == 0) goto LAB_0010ef11;
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
        boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                  (&local_38.m_imp);
        bVar9 = false;
        goto LAB_0010ef62;
      }
    }
    else {
LAB_0010ef11:
      cVar3 = (char)(ostream *)&local_4b8;
      std::ios::widen((char)*(undefined8 *)(local_4b8 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
    }
    boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
  } while( true );
}

Assistant:

bool prepareWord2vecInput(const std::string& dir_name, const std::string& out_filename, const std::unordered_map<std::string, std::vector<std::string>>& dict)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(out_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                //std::cout << p.string() << std::endl;
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                while (std::getline(fi, line) and !line.empty())
                {
                    of << line;
                    std::unordered_map<std::string, std::vector<std::string>>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    for (const auto& s: it->second)
                    {
                        of << " " << s;
                    }
                    of << " ";
                }                
            }
            of << std::endl; 
        }
        return true;
    }